

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::parse_range_header(string *s,Ranges *ranges)

{
  bool bVar1;
  int iVar2;
  difference_type dVar3;
  difference_type dVar4;
  undefined1 uVar5;
  Ranges *in_R9;
  detail *this;
  anon_class_16_2_311984b8 fn;
  bool all_valid_ranges;
  smatch m;
  
  if (parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
      ::re_first_range_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
                                 ::re_first_range_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
                  ::re_first_range_abi_cxx11_,"bytes=(\\d*-\\d*(?:,\\s*\\d*-\\d*)*)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
                    ::re_first_range_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
                           ::re_first_range_abi_cxx11_);
    }
  }
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m._M_begin._M_current = (char *)0x0;
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (s,&m,&parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
                           ::re_first_range_abi_cxx11_,0);
  if (bVar1) {
    dVar3 = std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::position(&m,1);
    dVar4 = std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::length(&m,1);
    all_valid_ranges = true;
    this = (detail *)((s->_M_dataplus)._M_p + dVar3);
    fn.ranges = in_R9;
    fn.all_valid_ranges = (bool *)ranges;
    split<httplib::detail::parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)::_lambda(char_const*,char_const*)_1_>
              (this,(char *)(this + dVar4),(char *)0x2c,(char)&all_valid_ranges,fn);
    uVar5 = all_valid_ranges;
  }
  else {
    uVar5 = 0;
  }
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&m);
  return (bool)uVar5;
}

Assistant:

inline bool parse_range_header(const std::string &s, Ranges &ranges) {
  static auto re_first_range = std::regex(R"(bytes=(\d*-\d*(?:,\s*\d*-\d*)*))");
  std::smatch m;
  if (std::regex_match(s, m, re_first_range)) {
    auto pos = m.position(1);
    auto len = m.length(1);
    bool all_valid_ranges = true;
    split(&s[pos], &s[pos + len], ',', [&](const char *b, const char *e) {
      if (!all_valid_ranges) return;
      static auto re_another_range = std::regex(R"(\s*(\d*)-(\d*))");
      std::cmatch m;
      if (std::regex_match(b, e, m, re_another_range)) {
        ssize_t first = -1;
        if (!m.str(1).empty()) {
          first = static_cast<ssize_t>(std::stoll(m.str(1)));
        }

        ssize_t last = -1;
        if (!m.str(2).empty()) {
          last = static_cast<ssize_t>(std::stoll(m.str(2)));
        }

        if (first != -1 && last != -1 && first > last) {
          all_valid_ranges = false;
          return;
        }
        ranges.emplace_back(std::make_pair(first, last));
      }
    });
    return all_valid_ranges;
  }
  return false;
}